

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetActiveID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiInputSource IVar2;
  ImGuiWindow *in_RSI;
  uint in_EDI;
  bool bVar3;
  ImGuiContext *g;
  char *local_40;
  char *local_28;
  
  pIVar1 = GImGui;
  if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) &&
     (GImGui->ActiveId == GImGui->MovingWindow->MoveId)) {
    if ((GImGui->DebugLogFlags & 1U) != 0) {
      DebugLog("SetActiveID() cancel MovingWindow\n");
    }
    pIVar1->MovingWindow = (ImGuiWindow *)0x0;
  }
  pIVar1->ActiveIdIsJustActivated = pIVar1->ActiveId != in_EDI;
  if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
    if ((pIVar1->DebugLogFlags & 1U) != 0) {
      if (pIVar1->ActiveIdWindow == (ImGuiWindow *)0x0) {
        local_28 = "";
      }
      else {
        local_28 = pIVar1->ActiveIdWindow->Name;
      }
      if (in_RSI == (ImGuiWindow *)0x0) {
        local_40 = "";
      }
      else {
        local_40 = in_RSI->Name;
      }
      DebugLog("SetActiveID() old:0x%08X (window \"%s\") -> new:0x%08X (window \"%s\")\n",
               (ulong)pIVar1->ActiveId,local_28,(ulong)in_EDI,local_40);
    }
    pIVar1->ActiveIdTimer = 0.0;
    pIVar1->ActiveIdHasBeenPressedBefore = false;
    pIVar1->ActiveIdHasBeenEditedBefore = false;
    pIVar1->ActiveIdMouseButton = -1;
    if (in_EDI != 0) {
      pIVar1->LastActiveId = in_EDI;
      pIVar1->LastActiveIdTimer = 0.0;
    }
  }
  pIVar1->ActiveId = in_EDI;
  pIVar1->ActiveIdAllowOverlap = false;
  pIVar1->ActiveIdNoClearOnFocusLoss = false;
  pIVar1->ActiveIdWindow = in_RSI;
  pIVar1->ActiveIdHasBeenEditedThisFrame = false;
  if (in_EDI != 0) {
    pIVar1->ActiveIdIsAlive = in_EDI;
    bVar3 = true;
    if ((pIVar1->NavActivateId != in_EDI) && (bVar3 = true, pIVar1->NavActivateInputId != in_EDI)) {
      bVar3 = pIVar1->NavJustMovedToId == in_EDI;
    }
    IVar2 = ImGuiInputSource_Mouse;
    if (bVar3) {
      IVar2 = ImGuiInputSource_Nav;
    }
    pIVar1->ActiveIdSource = IVar2;
  }
  pIVar1->ActiveIdUsingNavDirMask = 0;
  pIVar1->ActiveIdUsingAllKeyboardKeys = false;
  pIVar1->ActiveIdUsingNavInputMask = 0;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    // While most behaved code would make an effort to not steal active id during window move/drag operations,
    // we at least need to be resilient to it. Cancelling the move is rather aggressive and users of 'master' branch
    // may prefer the weird ill-defined half working situation ('docking' did assert), so may need to rework that.
    if (g.MovingWindow != NULL && g.ActiveId == g.MovingWindow->MoveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("SetActiveID() cancel MovingWindow\n");
        g.MovingWindow = NULL;
    }

    // Set active id
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    if (g.ActiveIdIsJustActivated)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("SetActiveID() old:0x%08X (window \"%s\") -> new:0x%08X (window \"%s\")\n", g.ActiveId, g.ActiveIdWindow ? g.ActiveIdWindow->Name : "", id, window ? window->Name : "");
        g.ActiveIdTimer = 0.0f;
        g.ActiveIdHasBeenPressedBefore = false;
        g.ActiveIdHasBeenEditedBefore = false;
        g.ActiveIdMouseButton = -1;
        if (id != 0)
        {
            g.LastActiveId = id;
            g.LastActiveIdTimer = 0.0f;
        }
    }
    g.ActiveId = id;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdNoClearOnFocusLoss = false;
    g.ActiveIdWindow = window;
    g.ActiveIdHasBeenEditedThisFrame = false;
    if (id)
    {
        g.ActiveIdIsAlive = id;
        g.ActiveIdSource = (g.NavActivateId == id || g.NavActivateInputId == id || g.NavJustMovedToId == id) ? (ImGuiInputSource)ImGuiInputSource_Nav : ImGuiInputSource_Mouse;
    }

    // Clear declaration of inputs claimed by the widget
    // (Please note that this is WIP and not all keys/inputs are thoroughly declared by all widgets yet)
    g.ActiveIdUsingNavDirMask = 0x00;
    g.ActiveIdUsingAllKeyboardKeys = false;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    g.ActiveIdUsingNavInputMask = 0x00;
#endif
}